

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  int *in_RSI;
  int *in_RDI;
  uint32_t res;
  int i;
  int local_18;
  int local_14;
  
  local_18 = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)0x113cdf);
  local_14 = 0;
  do {
    if (0xc < local_14) {
LAB_00113d20:
      if (local_18 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/scalar_low_impl.h"
                ,0xba,"test condition failed: res != 0");
        abort();
      }
      *in_RDI = local_18;
      secp256k1_scalar_verify((secp256k1_scalar *)0x113d80);
      return;
    }
    if ((uint)(local_14 * *in_RSI) % 0xd == 1) {
      local_18 = local_14;
      goto LAB_00113d20;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    uint32_t res = 0;
    SECP256K1_SCALAR_VERIFY(x);

    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1) {
            res = i;
            break;
        }
    }

    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(res != 0);
    *r = res;

    SECP256K1_SCALAR_VERIFY(r);
}